

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

GenericClassDefSymbol * __thiscall
slang::TypedBumpAllocator<slang::ast::GenericClassDefSymbol>::
emplace<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *this,
          basic_string_view<char,_std::char_traits<char>_> *args,SourceLocation *args_1)

{
  Segment *pSVar1;
  size_t sVar2;
  char *pcVar3;
  SourceLocation SVar4;
  GenericClassDefSymbol *pGVar5;
  
  pSVar1 = (this->super_BumpAllocator).head;
  pGVar5 = (GenericClassDefSymbol *)((ulong)(pSVar1->current + 7) & 0xfffffffffffffff8);
  if ((GenericClassDefSymbol *)(this->super_BumpAllocator).endPtr < pGVar5 + 1) {
    pGVar5 = (GenericClassDefSymbol *)
             BumpAllocator::allocateSlow(&this->super_BumpAllocator,0x2f0,8);
  }
  else {
    pSVar1->current = (byte *)(pGVar5 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar4 = *args_1;
  (pGVar5->super_Symbol).kind = GenericClassDef;
  (pGVar5->super_Symbol).name._M_len = sVar2;
  (pGVar5->super_Symbol).name._M_str = pcVar3;
  (pGVar5->super_Symbol).location = SVar4;
  (pGVar5->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pGVar5->super_Symbol).parentScope = (Scope *)0x0;
  (pGVar5->super_Symbol).nextInScope = (Symbol *)0x0;
  (pGVar5->super_Symbol).indexInScope = 0;
  pGVar5->isInterface = false;
  (pGVar5->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_ =
       (pointer)(pGVar5->paramDecls).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.firstElement;
  (pGVar5->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len = 0;
  (pGVar5->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.cap = 8;
  (pGVar5->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (pGVar5->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (pGVar5->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (pGVar5->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (pGVar5->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (pGVar5->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (pGVar5->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (pGVar5->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (pGVar5->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (pGVar5->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (pGVar5->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (pGVar5->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (pGVar5->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = false;
  pGVar5->firstForward = (ForwardingTypedefSymbol *)0x0;
  pGVar5->recursionDepth = 0;
  (pGVar5->specializeFunc).callback =
       (_func_void_intptr_t_Compilation_ptr_ClassType_ptr_SourceLocation *)0x0;
  return pGVar5;
}

Assistant:

T* emplace(Args&&... args) {
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }